

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O3

void tinyfd_beep(void)

{
  int iVar1;
  char *pcVar2;
  FILE *pFVar3;
  size_t __n;
  char lDialogString [256];
  char local_408 [1024];
  
  iVar1 = osascriptPresent();
  if (iVar1 == 0) {
    if (pactlPresent_lPactlPresent < 0) {
      pactlPresent_lPactlPresent = detectPresence("pactl");
    }
    if (pactlPresent_lPactlPresent == 0) {
      if (speakertestPresent_lSpeakertestPresent < 0) {
        speakertestPresent_lSpeakertestPresent = detectPresence("speaker-test");
      }
      if (speakertestPresent_lSpeakertestPresent == 0) {
        if (beepexePresent_lBeepexePresent < 0) {
          beepexePresent_lBeepexePresent = detectPresence("beep.exe");
        }
        if (beepexePresent_lBeepexePresent == 0) {
          if (playPresent_lPlayPresent < 0) {
            playPresent_lPlayPresent = detectPresence("sox");
          }
          if (playPresent_lPlayPresent == 0) {
            if (beepPresent_lBeepPresent < 0) {
              beepPresent_lBeepPresent = detectPresence("beep");
            }
            if (beepPresent_lBeepPresent == 0) {
              builtin_strncpy(local_408,"printf \'\a\' > /dev/tty",0x16);
            }
            else {
              builtin_strncpy(local_408,"beep -f 440 -l 300",0x13);
            }
          }
          else {
            builtin_strncpy(local_408,"play -q -n synth .3 sine 440",0x1d);
          }
        }
        else {
          local_408[0] = 'b';
          local_408[1] = 'e';
          local_408[2] = 'e';
          local_408[3] = 'p';
          local_408[4] = '.';
          local_408[5] = 'e';
          local_408[6] = 'x';
          local_408[7] = 'e';
          builtin_strncpy(local_408 + 8," 440 300",9);
        }
        goto LAB_00158dfb;
      }
      pcVar2 = "( speaker-test -t sine -f 440 > /dev/tty )& pid=$!;sleep .5; kill -9 $pid";
      __n = 0x4a;
    }
    else {
      signal(2,sigHandler);
      pcVar2 = 
      "thnum=$(pactl load-module module-sine frequency=440);sleep .3;pactl unload-module $thnum";
      __n = 0x59;
    }
    memcpy(local_408,pcVar2,__n);
  }
  else {
    if ((int)afplayPresent_lAfplayPresent < 0) {
      afplayPresent_lAfplayPresent = detectPresence("afplay");
      if (afplayPresent_lAfplayPresent != 0) {
        pFVar3 = popen("test -e /System/Library/Sounds/Ping.aiff || echo Ping","r");
        pcVar2 = fgets(local_408,0x400,pFVar3);
        if (pcVar2 == (char *)0x0) {
          afplayPresent_lAfplayPresent = 2;
        }
        pclose(pFVar3);
        if (tinyfd_verbose != 0) {
          printf("afplay %d\n",(ulong)afplayPresent_lAfplayPresent);
        }
      }
    }
    iVar1 = graphicMode();
    if ((iVar1 == 0) || ((int)afplayPresent_lAfplayPresent < 2)) {
      builtin_strncpy(local_408,"osascript -e \'tell application \"System Events\" to beep\'",0x38);
    }
    else {
      builtin_strncpy(local_408,"afplay /System/Library/Sounds/Ping.aiff",0x28);
    }
  }
LAB_00158dfb:
  if (tinyfd_verbose != 0) {
    printf("lDialogString: %s\n",local_408);
  }
  pFVar3 = popen(local_408,"r");
  if (pFVar3 != (FILE *)0x0) {
    pclose(pFVar3);
  }
  if (pactlPresent_lPactlPresent < 0) {
    pactlPresent_lPactlPresent = detectPresence("pactl");
  }
  if (pactlPresent_lPactlPresent != 0) {
    signal(2,(__sighandler_t)0x0);
  }
  return;
}

Assistant:

void tinyfd_beep(void)
{
        char lDialogString[256] ;
        FILE * lIn ;

        if ( osascriptPresent() )
        {
                if ( afplayPresent() >= 2 )
                {
                        strcpy( lDialogString , "afplay /System/Library/Sounds/Ping.aiff") ;
                }
                else
                {
                        strcpy( lDialogString , "osascript -e 'tell application \"System Events\" to beep'") ;
                }
        }
        else if ( pactlPresent() )
        {
                signal(SIGINT, sigHandler);
                /*strcpy( lDialogString , "pactl load-module module-sine frequency=440;sleep .3;pactl unload-module module-sine" ) ;*/
                strcpy( lDialogString , "thnum=$(pactl load-module module-sine frequency=440);sleep .3;pactl unload-module $thnum" ) ;
        }
        else if ( speakertestPresent() )
        {
                /*strcpy( lDialogString , "timeout -k .3 .3 speaker-test --frequency 440 --test sine > /dev/tty" ) ;*/
                strcpy( lDialogString , "( speaker-test -t sine -f 440 > /dev/tty )& pid=$!;sleep .5; kill -9 $pid" ) ; /*.3 was too short for mac g3*/
        }
        else if (beepexePresent())
        {
                strcpy(lDialogString, "beep.exe 440 300");
        }
        else if (playPresent()) /* play is part of sox */
        {
                strcpy(lDialogString, "play -q -n synth .3 sine 440");
        }
        else if ( beepPresent() )
        {
                strcpy( lDialogString , "beep -f 440 -l 300" ) ;
        }
        else
        {
                strcpy( lDialogString , "printf '\a' > /dev/tty" ) ;
        }

        if (tinyfd_verbose) printf( "lDialogString: %s\n" , lDialogString ) ;

        if ( ( lIn = popen( lDialogString , "r" ) ) )
        {
                pclose( lIn ) ;
        }

        if ( pactlPresent() )
        {
                signal(SIGINT, SIG_DFL);
        }
}